

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_mean(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  float fVar20;
  ggml_tensor *src0;
  long local_68;
  long local_60;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x818,"fatal error");
  }
  if ((params->ith == 0) && (lVar2 = pgVar1->ne[3], 0 < lVar2)) {
    local_60 = 0;
    local_68 = 0;
    sVar3 = pgVar1->nb[3];
    lVar4 = pgVar1->ne[0];
    lVar5 = pgVar1->ne[1];
    lVar6 = pgVar1->ne[2];
    sVar7 = pgVar1->nb[1];
    sVar8 = pgVar1->nb[2];
    sVar9 = dst->nb[1];
    sVar10 = dst->nb[2];
    sVar11 = dst->nb[3];
    uVar19 = (uint)lVar4;
    do {
      if (0 < lVar6) {
        lVar16 = 0;
        lVar17 = local_60;
        do {
          if (0 < lVar5) {
            pvVar12 = dst->data;
            lVar13 = 0;
            lVar18 = (long)pgVar1->data + lVar17;
            do {
              if ((int)uVar19 < 1) {
                fVar20 = 0.0;
              }
              else {
                fVar20 = 0.0;
                uVar14 = 0;
                do {
                  lVar15 = uVar14 * 4;
                  uVar14 = uVar14 + 1;
                  fVar20 = fVar20 + *(float *)(lVar18 + lVar15);
                } while ((uVar19 & 0x7fffffff) != uVar14);
              }
              lVar15 = lVar13 * sVar9;
              lVar13 = lVar13 + 1;
              lVar18 = lVar18 + sVar7;
              *(float *)((long)pvVar12 + lVar15 + local_68 * sVar11 + lVar16 * sVar10) =
                   fVar20 / (float)lVar4;
            } while (lVar13 != lVar5);
          }
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + sVar8;
        } while (lVar16 != lVar6);
      }
      local_60 = local_60 + sVar3;
      local_68 = local_68 + 1;
    } while (local_68 != lVar2);
  }
  return;
}

Assistant:

void ggml_compute_forward_mean(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_mean_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}